

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlParseDoc(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  char *val_00;
  htmlDocPtr val_01;
  int local_34;
  int n_encoding;
  char *encoding;
  int n_cur;
  xmlChar *cur;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (encoding._4_4_ = 0; (int)encoding._4_4_ < 5; encoding._4_4_ = encoding._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_xmlChar_ptr(encoding._4_4_,0);
      val_00 = gen_const_char_ptr(local_34,1);
      val_01 = (htmlDocPtr)htmlParseDoc(val,val_00);
      desret_htmlDocPtr(val_01);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(encoding._4_4_,val,0);
      des_const_char_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)encoding._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlParseDoc(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    const xmlChar * cur; /* a pointer to an array of xmlChar */
    int n_cur;
    const char * encoding; /* the encoding (optional) */
    int n_encoding;

    for (n_cur = 0;n_cur < gen_nb_const_xmlChar_ptr;n_cur++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
        mem_base = xmlMemBlocks();
        cur = gen_const_xmlChar_ptr(n_cur, 0);
        encoding = gen_const_char_ptr(n_encoding, 1);

        ret_val = htmlParseDoc(cur, encoding);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_cur, cur, 0);
        des_const_char_ptr(n_encoding, encoding, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlParseDoc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_encoding);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}